

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void slang::ast::ParameterSymbolBase::fromLocalSyntax
               (Scope *scope,ParameterDeclarationStatementSyntax *syntax,
               SmallVectorBase<slang::ast::Symbol_*> *results)

{
  Symbol *pSVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  pointer ppPVar2;
  long lVar3;
  TypeParameterDeclarationSyntax *syntax_02;
  long lVar4;
  Symbol *local_80;
  SmallVectorBase<slang::ast::Symbol_*> *local_78;
  SmallVector<slang::ast::ParameterSymbol_*,_5UL> params;
  
  syntax_02 = (TypeParameterDeclarationSyntax *)(syntax->parameter).ptr;
  local_78 = results;
  if ((syntax_02->super_ParameterDeclarationBaseSyntax).super_SyntaxNode.kind ==
      ParameterDeclaration) {
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.data_ =
         (pointer)params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.firstElement;
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.len = 0;
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.cap = 5;
    ParameterSymbol::fromSyntax
              (scope,(ParameterDeclarationSyntax *)syntax_02,true,false,
               &params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>);
    ppPVar2 = params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.data_;
    lVar4 = params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.len << 3;
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 8) {
      pSVar1 = *(Symbol **)((long)ppPVar2 + lVar3);
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(pSVar1,scope,syntax_00);
      syntax_02 = (TypeParameterDeclarationSyntax *)&local_80;
      local_80 = pSVar1;
      SmallVectorBase<slang::ast::Symbol*>::emplace_back<slang::ast::Symbol*>
                ((SmallVectorBase<slang::ast::Symbol*> *)local_78,(Symbol **)syntax_02);
    }
    SmallVectorBase<slang::ast::ParameterSymbol_*>::cleanup
              (&params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>,
               (EVP_PKEY_CTX *)syntax_02);
  }
  else {
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.data_ =
         (pointer)params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.firstElement;
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.len = 0;
    params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.cap = 5;
    TypeParameterSymbol::fromSyntax
              (scope,syntax_02,true,false,
               (SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)&params);
    ppPVar2 = params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.data_;
    lVar4 = params.super_SmallVectorBase<slang::ast::ParameterSymbol_*>.len << 3;
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 8) {
      pSVar1 = *(Symbol **)((long)ppPVar2 + lVar3);
      syntax_01._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_01._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(pSVar1,scope,syntax_01);
      syntax_02 = (TypeParameterDeclarationSyntax *)&local_80;
      local_80 = pSVar1;
      SmallVectorBase<slang::ast::Symbol*>::emplace_back<slang::ast::Symbol*>
                ((SmallVectorBase<slang::ast::Symbol*> *)local_78,(Symbol **)syntax_02);
    }
    SmallVectorBase<slang::ast::TypeParameterSymbol_*>::cleanup
              ((SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)&params,
               (EVP_PKEY_CTX *)syntax_02);
  }
  return;
}

Assistant:

void ParameterSymbolBase::fromLocalSyntax(const Scope& scope,
                                          const ParameterDeclarationStatementSyntax& syntax,
                                          SmallVectorBase<Symbol*>& results) {
    auto paramBase = syntax.parameter;
    if (paramBase->kind == SyntaxKind::ParameterDeclaration) {
        SmallVector<ParameterSymbol*> params;
        ParameterSymbol::fromSyntax(scope, paramBase->as<ParameterDeclarationSyntax>(),
                                    /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
    else {
        SmallVector<TypeParameterSymbol*> params;
        TypeParameterSymbol::fromSyntax(scope, paramBase->as<TypeParameterDeclarationSyntax>(),
                                        /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
}